

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerMSL::emit_tessellation_io_load
          (CompilerMSL *this,uint32_t result_type_id,uint32_t id,uint32_t ptr)

{
  Types TVar1;
  ulong uVar2;
  ID id_00;
  bool bVar3;
  bool bVar4;
  ExecutionModel EVar5;
  uint32_t index;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  uint uVar9;
  SPIRType *pSVar10;
  SPIRType *pSVar11;
  SPIRType *pSVar12;
  SPIRType *pSVar13;
  SPIRVariable *var;
  SPIRType *pSVar14;
  SPIRType *pSVar15;
  CompilerError *pCVar16;
  byte bVar17;
  uint32_t uVar18;
  string *psVar19;
  uint32_t uVar20;
  bool bVar21;
  bool bVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  ID local_114;
  uint32_t indices [3];
  string expr;
  AccessChainMeta meta;
  uint local_88;
  ulong local_68;
  string local_60;
  uint32_t local_3c;
  SPIRVariable *local_38;
  
  local_114.id = ptr;
  pSVar10 = Compiler::expression_type((Compiler *)this,ptr);
  pSVar11 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type_id);
  if ((pSVar10->storage == StorageClassInput) ||
     ((pSVar10->storage == StorageClassOutput &&
      (EVar5 = Compiler::get_execution_model((Compiler *)this),
      EVar5 != ExecutionModelTessellationEvaluation)))) {
    EVar5 = Compiler::get_execution_model((Compiler *)this);
    if ((EVar5 == ExecutionModelTessellationControl) &&
       ((this->msl_options).multi_patch_workgroup == true)) {
      bVar21 = pSVar10->storage == StorageClassInput;
    }
    else {
      bVar21 = false;
    }
    pSVar13 = pSVar11;
    local_3c = result_type_id;
    bVar3 = Compiler::is_matrix((Compiler *)this,pSVar11);
    bVar22 = pSVar10->storage == StorageClassInput;
    bVar17 = (bVar21 ^ 1U) & bVar3 & bVar22;
    bVar3 = *(int *)&(pSVar11->super_IVariant).field_0xc != 0xf;
    if (((bVar17 != 0) ||
        (bVar4 = Compiler::is_array((Compiler *)this,pSVar11), bVar4 || !bVar3 && bVar22)) &&
       (id_00.id = local_114.id,
       bVar4 = Compiler::has_decoration((Compiler *)this,local_114,DecorationPatch), !bVar4)) {
      expr._M_dataplus._M_p = (pointer)&expr.field_2;
      expr._M_string_length = 0;
      expr.field_2._M_local_buf[0] = '\0';
      index = Compiler::get_extended_decoration
                        ((Compiler *)this,id_00.id,SPIRVCrossDecorationInterfaceMemberIndex);
      local_38 = Compiler::maybe_get_backing_variable((Compiler *)this,id_00.id);
      TVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
              super_VectorView<spirv_cross::Variant>.ptr[id_00.id].type;
      pSVar11 = Compiler::get_pointee_type((Compiler *)this,(pSVar10->super_IVariant).self.id);
      pSVar12 = Compiler::expression_type((Compiler *)this,(this->stage_in_ptr_var_id).id);
      uVar2 = (pSVar13->array).super_VectorView<unsigned_int>.buffer_size;
      if (2 < uVar2) {
        pCVar16 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_138,
                   "Cannot load tessellation IO variables with more than 2 dimensions.",
                   (allocator *)indices);
        CompilerError::CompilerError(pCVar16,&local_138);
        __cxa_throw(pCVar16,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (uVar2 == 2) {
        if (TVar1 != TypeVariable) {
          pCVar16 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_138,
                     "Loading an array-of-array must be loaded directly from an IO variable.",
                     (allocator *)indices);
          CompilerError::CompilerError(pCVar16,&local_138);
          __cxa_throw(pCVar16,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (index == 0xffffffff) {
          pCVar16 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_138,"Interface index is unknown. Cannot continue.",
                     (allocator *)indices);
          CompilerError::CompilerError(pCVar16,&local_138);
          __cxa_throw(pCVar16,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((~bVar17 & *(int *)&(pSVar13->super_IVariant).field_0xc != 0xf) == 0) {
          pCVar16 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_138,
                     "Cannot load array-of-array of composite type in tessellation IO.",
                     (allocator *)indices);
          CompilerError::CompilerError(pCVar16,&local_138);
          __cxa_throw(pCVar16,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        pSVar10 = pSVar13;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(indices,this,pSVar13,0);
        ::std::operator+(&local_138,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         indices,"({ ");
        ::std::__cxx11::string::append((string *)&expr);
        ::std::__cxx11::string::~string((string *)&local_138);
        ::std::__cxx11::string::~string((string *)indices);
        uVar6 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSVar13,1);
        pSVar13 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(pSVar13->parent_type).id);
        uVar18 = 0;
        while (uVar18 != uVar6) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)indices,
                     this,pSVar13,0);
          ::std::operator+(&local_138,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           indices,"({ ");
          pSVar12 = pSVar10;
          ::std::__cxx11::string::append((string *)&expr);
          ::std::__cxx11::string::~string((string *)&local_138);
          ::std::__cxx11::string::~string((string *)indices);
          uVar7 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSVar10,0);
          if (bVar21 == false) {
            uVar20 = 0;
            while (uVar7 != uVar20) {
              indices[1] = index + uVar20;
              meta.storage_physical_type = 0;
              meta.need_transpose = false;
              meta.storage_is_packed = false;
              meta.storage_is_invariant = false;
              meta.flattened_struct = false;
              indices[0] = uVar18;
              CompilerGLSL::access_chain_internal_abi_cxx11_
                        (&local_138,&this->super_CompilerGLSL,(this->stage_in_ptr_var_id).id,indices
                         ,2,5,&meta);
              ::std::__cxx11::string::append((string *)&expr);
              ::std::__cxx11::string::~string((string *)&local_138);
              bVar3 = Compiler::is_matrix((Compiler *)this,pSVar13);
              if ((!bVar3 && *(int *)&(pSVar13->super_IVariant).field_0xc != 0xf) &&
                 (pSVar13->vecsize < pSVar11->vecsize)) {
                CompilerGLSL::vector_swizzle(pSVar13->vecsize,0);
                ::std::__cxx11::string::append((char *)&expr);
              }
              uVar20 = uVar20 + 1;
              if (uVar20 < uVar7) {
                ::std::__cxx11::string::append((char *)&expr);
              }
            }
          }
          else {
            uVar20 = 0;
            while (uVar7 != uVar20) {
              meta.storage_physical_type = 0;
              meta.need_transpose = false;
              meta.storage_is_packed = false;
              meta.storage_is_invariant = false;
              meta.flattened_struct = false;
              indices[0] = uVar18;
              indices[1] = index;
              indices[2] = uVar20;
              CompilerGLSL::access_chain_internal_abi_cxx11_
                        (&local_138,&this->super_CompilerGLSL,(this->stage_in_ptr_var_id).id,indices
                         ,3,5,&meta);
              ::std::__cxx11::string::append((string *)&expr);
              ::std::__cxx11::string::~string((string *)&local_138);
              bVar3 = Compiler::is_matrix((Compiler *)this,pSVar13);
              if ((!bVar3 && *(int *)&(pSVar13->super_IVariant).field_0xc != 0xf) &&
                 (pSVar13->vecsize < pSVar11->vecsize)) {
                CompilerGLSL::vector_swizzle(pSVar13->vecsize,0);
                ::std::__cxx11::string::append((char *)&expr);
              }
              uVar20 = uVar20 + 1;
              if (uVar20 < uVar7) {
                ::std::__cxx11::string::append((char *)&expr);
              }
            }
          }
          ::std::__cxx11::string::append((char *)&expr);
          uVar18 = uVar18 + 1;
          pSVar10 = pSVar12;
          if (uVar18 < uVar6) {
            ::std::__cxx11::string::append((char *)&expr);
            pSVar10 = pSVar12;
          }
        }
        ::std::__cxx11::string::append((char *)&expr);
      }
      else if (bVar3 || !bVar22) {
        if (bVar17 == 0) {
          if (TVar1 == TypeVariable) {
            bVar21 = Compiler::is_array((Compiler *)this,pSVar13);
            if (!bVar21) {
              __assert_fail("is_array(result_type)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                            ,0x1741,
                            "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                           );
            }
            if ((pSVar13->array).super_VectorView<unsigned_int>.buffer_size != 1) {
              __assert_fail("result_type.array.size() == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                            ,0x1742,
                            "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                           );
            }
            if (index == 0xffffffff) {
              pCVar16 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_138,"Interface index is unknown. Cannot continue.",
                         (allocator *)indices);
              CompilerError::CompilerError(pCVar16,&local_138);
              __cxa_throw(pCVar16,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            pSVar10 = pSVar13;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (indices,this,pSVar13,0);
            ::std::operator+(&local_138,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             indices,"({ ");
            ::std::__cxx11::string::append((string *)&expr);
            ::std::__cxx11::string::~string((string *)&local_138);
            ::std::__cxx11::string::~string((string *)indices);
            uVar18 = 0;
            uVar6 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSVar13,0);
            while (uVar6 != uVar18) {
              meta.storage_physical_type = 0;
              meta.need_transpose = false;
              meta.storage_is_packed = false;
              meta.storage_is_invariant = false;
              meta.flattened_struct = false;
              indices[0] = uVar18;
              indices[1] = index;
              CompilerGLSL::access_chain_internal_abi_cxx11_
                        (&local_138,&this->super_CompilerGLSL,(this->stage_in_ptr_var_id).id,indices
                         ,2,5,&meta);
              ::std::__cxx11::string::append((string *)&expr);
              ::std::__cxx11::string::~string((string *)&local_138);
              if (pSVar10->vecsize < pSVar11->vecsize) {
                CompilerGLSL::vector_swizzle(pSVar10->vecsize,0);
                ::std::__cxx11::string::append((char *)&expr);
              }
              uVar18 = uVar18 + 1;
              if (uVar18 < uVar6) {
                ::std::__cxx11::string::append((char *)&expr);
              }
            }
            ::std::__cxx11::string::append((char *)&expr);
          }
          else {
            bVar21 = Compiler::is_array((Compiler *)this,pSVar13);
            if (!bVar21) {
              __assert_fail("is_array(result_type)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                            ,0x175d,
                            "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                           );
            }
            if ((pSVar13->array).super_VectorView<unsigned_int>.buffer_size != 1) {
              __assert_fail("result_type.array.size() == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                            ,0x175e,
                            "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                           );
            }
            if (index == 0xffffffff) {
              pCVar16 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_138,"Interface index is unknown. Cannot continue.",
                         (allocator *)indices);
              CompilerError::CompilerError(pCVar16,&local_138);
              __cxa_throw(pCVar16,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            pSVar10 = pSVar13;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (indices,this,pSVar13,0);
            ::std::operator+(&local_138,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             indices,"({ ");
            ::std::__cxx11::string::append((string *)&expr);
            ::std::__cxx11::string::~string((string *)&local_138);
            ::std::__cxx11::string::~string((string *)indices);
            uVar6 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSVar13,0);
            for (uVar9 = 1; uVar9 - uVar6 != 1; uVar9 = uVar9 + 1) {
              CompilerGLSL::to_expression_abi_cxx11_
                        ((string *)&meta,&this->super_CompilerGLSL,local_114.id,true);
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               indices,(string *)&meta,".");
              CompilerGLSL::to_member_name_abi_cxx11_
                        (&local_60,&this->super_CompilerGLSL,pSVar12,index);
              ::std::operator+(&local_138,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               indices,&local_60);
              ::std::__cxx11::string::append((string *)&expr);
              ::std::__cxx11::string::~string((string *)&local_138);
              ::std::__cxx11::string::~string((string *)&local_60);
              ::std::__cxx11::string::~string((string *)indices);
              ::std::__cxx11::string::~string((string *)&meta);
              if (pSVar10->vecsize < pSVar11->vecsize) {
                CompilerGLSL::vector_swizzle(pSVar10->vecsize,0);
                ::std::__cxx11::string::append((char *)&expr);
              }
              if (uVar9 < uVar6) {
                ::std::__cxx11::string::append((char *)&expr);
              }
              index = index + 1;
            }
            ::std::__cxx11::string::append((char *)&expr);
          }
        }
        else {
          bVar21 = Compiler::is_array((Compiler *)this,pSVar13);
          if (bVar21 && TVar1 != TypeVariable) {
            pCVar16 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_138,
                       "Loading array of matrix from IO variable must come directly from IO variable."
                       ,(allocator *)indices);
            CompilerError::CompilerError(pCVar16,&local_138);
            __cxa_throw(pCVar16,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (index == 0xffffffff) {
            pCVar16 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_138,"Interface index is unknown. Cannot continue.",
                       (allocator *)indices);
            CompilerError::CompilerError(pCVar16,&local_138);
            __cxa_throw(pCVar16,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (bVar21) {
            pSVar10 = pSVar13;
            uVar6 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSVar13,0);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (indices,this,pSVar13,0);
            ::std::operator+(&local_138,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             indices,"({ ");
            ::std::__cxx11::string::append((string *)&expr);
            ::std::__cxx11::string::~string((string *)&local_138);
            ::std::__cxx11::string::~string((string *)indices);
            var = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,local_114.id);
            pSVar13 = Compiler::get_variable_element_type((Compiler *)this,var);
            uVar18 = 0;
            while (uVar18 != uVar6) {
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         indices,this,pSVar13,0);
              ::std::operator+(&local_138,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               indices,"(");
              ::std::__cxx11::string::append((string *)&expr);
              ::std::__cxx11::string::~string((string *)&local_138);
              ::std::__cxx11::string::~string((string *)indices);
              uVar9 = 0;
              while (uVar9 < pSVar10->columns) {
                indices[1] = index + uVar9;
                meta.storage_physical_type = 0;
                meta.need_transpose = false;
                meta.storage_is_packed = false;
                meta.storage_is_invariant = false;
                meta.flattened_struct = false;
                indices[0] = uVar18;
                CompilerGLSL::access_chain_internal_abi_cxx11_
                          (&local_138,&this->super_CompilerGLSL,(this->stage_in_ptr_var_id).id,
                           indices,2,5,&meta);
                ::std::__cxx11::string::append((string *)&expr);
                ::std::__cxx11::string::~string((string *)&local_138);
                if (pSVar10->vecsize < pSVar11->vecsize) {
                  CompilerGLSL::vector_swizzle(pSVar10->vecsize,0);
                  ::std::__cxx11::string::append((char *)&expr);
                }
                uVar9 = uVar9 + 1;
                if (uVar9 < pSVar10->columns) {
                  ::std::__cxx11::string::append((char *)&expr);
                }
              }
              ::std::__cxx11::string::append((char *)&expr);
              uVar18 = uVar18 + 1;
              if (uVar18 < uVar6) {
                ::std::__cxx11::string::append((char *)&expr);
              }
            }
            ::std::__cxx11::string::append((char *)&expr);
          }
          else {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (indices,this,pSVar13,0);
            ::std::operator+(&local_138,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             indices,"(");
            ::std::__cxx11::string::append((string *)&expr);
            ::std::__cxx11::string::~string((string *)&local_138);
            ::std::__cxx11::string::~string((string *)indices);
            uVar9 = 0;
            while (uVar9 < pSVar13->columns) {
              CompilerGLSL::to_expression_abi_cxx11_
                        ((string *)&meta,&this->super_CompilerGLSL,local_114.id,true);
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               indices,(string *)&meta,".");
              CompilerGLSL::to_member_name_abi_cxx11_
                        (&local_60,&this->super_CompilerGLSL,pSVar12,index + uVar9);
              ::std::operator+(&local_138,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               indices,&local_60);
              ::std::__cxx11::string::append((string *)&expr);
              ::std::__cxx11::string::~string((string *)&local_138);
              ::std::__cxx11::string::~string((string *)&local_60);
              ::std::__cxx11::string::~string((string *)indices);
              ::std::__cxx11::string::~string((string *)&meta);
              if (pSVar13->vecsize < pSVar11->vecsize) {
                CompilerGLSL::vector_swizzle(pSVar13->vecsize,0);
                ::std::__cxx11::string::append((char *)&expr);
              }
              uVar9 = uVar9 + 1;
              if (uVar9 < pSVar13->columns) {
                ::std::__cxx11::string::append((char *)&expr);
              }
            }
            ::std::__cxx11::string::append((char *)&expr);
          }
        }
      }
      else {
        bVar3 = Compiler::is_array((Compiler *)this,pSVar13);
        if (bVar3 && TVar1 != TypeVariable) {
          pCVar16 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_138,
                     "Loading array of struct from IO variable must come directly from IO variable."
                     ,(allocator *)indices);
          CompilerError::CompilerError(pCVar16,&local_138);
          __cxa_throw(pCVar16,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (bVar3) {
          pSVar14 = pSVar13;
          local_88 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSVar13,0);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(indices,this,pSVar13,0);
          ::std::operator+(&local_138,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           indices,"({ ");
          ::std::__cxx11::string::append((string *)&expr);
          ::std::__cxx11::string::~string((string *)&local_138);
          ::std::__cxx11::string::~string((string *)indices);
          pSVar13 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(pSVar14->parent_type).id)
          ;
        }
        else {
          local_88 = 1;
        }
        if ((pSVar13->array).super_VectorView<unsigned_int>.buffer_size != 0) {
          __assert_fail("struct_type.array.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x1693,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        uVar9 = 0;
        while (uVar9 != local_88) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    ((string *)indices,this,pSVar13,0);
          ::std::operator+(&local_138,(string *)indices,"{ ");
          ::std::__cxx11::string::append((string *)&expr);
          ::std::__cxx11::string::~string((string *)&local_138);
          ::std::__cxx11::string::~string((string *)indices);
          local_68 = 0;
          while (local_68 <
                 (uint)(pSVar13->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size) {
            if (local_38 != (SPIRVariable *)0x0) {
              index = Compiler::get_extended_member_decoration
                                ((Compiler *)this,(local_38->super_IVariant).self.id,
                                 (uint32_t)local_68,SPIRVCrossDecorationInterfaceMemberIndex);
            }
            if (index == 0xffffffff) {
              pCVar16 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_138,"Interface index is unknown. Cannot continue.",
                         (allocator *)indices);
              CompilerError::CompilerError(pCVar16,&local_138);
              __cxa_throw(pCVar16,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            pSVar14 = Compiler::get<spirv_cross::SPIRType>
                                ((Compiler *)this,
                                 (pSVar13->member_types).
                                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                                 [local_68].id);
            pSVar15 = Compiler::get<spirv_cross::SPIRType>
                                ((Compiler *)this,
                                 (pSVar11->member_types).
                                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                                 [local_68].id);
            bVar22 = Compiler::is_matrix((Compiler *)this,pSVar14);
            if ((pSVar10->storage == StorageClassInput && bVar21 == false) && (~bVar22 & 1U) == 0) {
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        ((string *)indices,this,pSVar14,0);
              ::std::operator+(&local_138,(string *)indices,"(");
              ::std::__cxx11::string::append((string *)&expr);
              ::std::__cxx11::string::~string((string *)&local_138);
              ::std::__cxx11::string::~string((string *)indices);
              uVar8 = 0;
              while (uVar6 = index + uVar8, uVar8 < pSVar14->columns) {
                if (bVar3) {
                  meta.storage_physical_type = 0;
                  meta.need_transpose = false;
                  meta.storage_is_packed = false;
                  meta.storage_is_invariant = false;
                  meta.flattened_struct = false;
                  psVar19 = &local_138;
                  indices[0] = uVar9;
                  indices[1] = uVar6;
                  CompilerGLSL::access_chain_internal_abi_cxx11_
                            (psVar19,&this->super_CompilerGLSL,(this->stage_in_ptr_var_id).id,
                             indices,2,5,&meta);
                  ::std::__cxx11::string::append((string *)&expr);
                }
                else {
                  CompilerGLSL::to_expression_abi_cxx11_
                            ((string *)&meta,&this->super_CompilerGLSL,local_114.id,true);
                  ::std::operator+((string *)indices,(string *)&meta,".");
                  CompilerGLSL::to_member_name_abi_cxx11_
                            (&local_60,&this->super_CompilerGLSL,pSVar12,uVar6);
                  ::std::operator+(&local_138,(string *)indices,&local_60);
                  ::std::__cxx11::string::append((string *)&expr);
                  ::std::__cxx11::string::~string((string *)&local_138);
                  ::std::__cxx11::string::~string((string *)&local_60);
                  ::std::__cxx11::string::~string((string *)indices);
                  psVar19 = (string *)&meta;
                }
                ::std::__cxx11::string::~string((string *)psVar19);
                if (pSVar14->vecsize < pSVar15->vecsize) {
                  CompilerGLSL::vector_swizzle(pSVar14->vecsize,0);
                  ::std::__cxx11::string::append((char *)&expr);
                }
                uVar8 = uVar8 + 1;
                if (uVar8 < pSVar14->columns) {
                  ::std::__cxx11::string::append((char *)&expr);
                }
              }
              ::std::__cxx11::string::append((char *)&expr);
              index = uVar6;
            }
            else {
              bVar22 = Compiler::is_array((Compiler *)this,pSVar14);
              if (bVar22) {
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          ((string *)indices,this,pSVar14,0);
                ::std::operator+(&local_138,(string *)indices,"({ ");
                ::std::__cxx11::string::append((string *)&expr);
                ::std::__cxx11::string::~string((string *)&local_138);
                ::std::__cxx11::string::~string((string *)indices);
                uVar6 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSVar14,0);
                if (bVar21 == false) {
                  uVar18 = 0;
                  while (uVar7 = index + uVar18, uVar6 != uVar18) {
                    if (bVar3) {
                      meta.storage_physical_type = 0;
                      meta.need_transpose = false;
                      meta.storage_is_packed = false;
                      meta.storage_is_invariant = false;
                      meta.flattened_struct = false;
                      psVar19 = &local_138;
                      indices[0] = uVar9;
                      indices[1] = uVar7;
                      CompilerGLSL::access_chain_internal_abi_cxx11_
                                (psVar19,&this->super_CompilerGLSL,(this->stage_in_ptr_var_id).id,
                                 indices,2,5,&meta);
                      ::std::__cxx11::string::append((string *)&expr);
                    }
                    else {
                      CompilerGLSL::to_expression_abi_cxx11_
                                ((string *)&meta,&this->super_CompilerGLSL,local_114.id,true);
                      ::std::operator+((string *)indices,(string *)&meta,".");
                      CompilerGLSL::to_member_name_abi_cxx11_
                                (&local_60,&this->super_CompilerGLSL,pSVar12,uVar7);
                      ::std::operator+(&local_138,(string *)indices,&local_60);
                      ::std::__cxx11::string::append((string *)&expr);
                      ::std::__cxx11::string::~string((string *)&local_138);
                      ::std::__cxx11::string::~string((string *)&local_60);
                      ::std::__cxx11::string::~string((string *)indices);
                      psVar19 = (string *)&meta;
                    }
                    ::std::__cxx11::string::~string((string *)psVar19);
                    if (pSVar14->vecsize < pSVar15->vecsize) {
                      CompilerGLSL::vector_swizzle(pSVar14->vecsize,0);
                      ::std::__cxx11::string::append((char *)&expr);
                    }
                    uVar18 = uVar18 + 1;
                    if (uVar18 < uVar6) {
                      ::std::__cxx11::string::append((char *)&expr);
                    }
                  }
                }
                else {
                  uVar8 = 0;
                  while (local_60._M_dataplus._M_p._0_4_ = uVar8, uVar7 = index, uVar8 < uVar6) {
                    if (bVar3) {
                      meta.storage_physical_type = 0;
                      meta.need_transpose = false;
                      meta.storage_is_packed = false;
                      meta.storage_is_invariant = false;
                      meta.flattened_struct = false;
                      indices[0] = uVar9;
                      indices[1] = index;
                      indices[2] = uVar8;
                      CompilerGLSL::access_chain_internal_abi_cxx11_
                                (&local_138,&this->super_CompilerGLSL,(this->stage_in_ptr_var_id).id
                                 ,indices,3,5,&meta);
                      ::std::__cxx11::string::append((string *)&expr);
                      psVar19 = &local_138;
                    }
                    else {
                      CompilerGLSL::to_expression_abi_cxx11_
                                ((string *)indices,&this->super_CompilerGLSL,local_114.id,true);
                      CompilerGLSL::to_member_name_abi_cxx11_
                                ((string *)&meta,&this->super_CompilerGLSL,pSVar12,index);
                      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                                (&local_138,(spirv_cross *)indices,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x30abe2,(char (*) [2])&meta,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x31c69e,(char (*) [2])&local_60,(uint *)0x30e88f,
                                 (char (*) [2])pSVar13);
                      ::std::__cxx11::string::append((string *)&expr);
                      ::std::__cxx11::string::~string((string *)&local_138);
                      ::std::__cxx11::string::~string((string *)&meta);
                      psVar19 = (string *)indices;
                    }
                    ::std::__cxx11::string::~string((string *)psVar19);
                    if (pSVar14->vecsize < pSVar15->vecsize) {
                      CompilerGLSL::vector_swizzle(pSVar14->vecsize,0);
                      ::std::__cxx11::string::append((char *)&expr);
                    }
                    uVar8 = (uint)local_60._M_dataplus._M_p + 1;
                    if (uVar8 < uVar6) {
                      ::std::__cxx11::string::append((char *)&expr);
                      uVar8 = (uint)local_60._M_dataplus._M_p + 1;
                    }
                  }
                }
                ::std::__cxx11::string::append((char *)&expr);
                index = uVar7;
              }
              else {
                if (bVar3) {
                  meta.storage_physical_type = 0;
                  meta.need_transpose = false;
                  meta.storage_is_packed = false;
                  meta.storage_is_invariant = false;
                  meta.flattened_struct = false;
                  psVar19 = &local_138;
                  indices[0] = uVar9;
                  indices[1] = index;
                  CompilerGLSL::access_chain_internal_abi_cxx11_
                            (psVar19,&this->super_CompilerGLSL,(this->stage_in_ptr_var_id).id,
                             indices,2,5,&meta);
                  ::std::__cxx11::string::append((string *)&expr);
                }
                else {
                  CompilerGLSL::to_expression_abi_cxx11_
                            ((string *)&meta,&this->super_CompilerGLSL,local_114.id,true);
                  ::std::operator+((string *)indices,(string *)&meta,".");
                  CompilerGLSL::to_member_name_abi_cxx11_
                            (&local_60,&this->super_CompilerGLSL,pSVar12,index);
                  ::std::operator+(&local_138,(string *)indices,&local_60);
                  ::std::__cxx11::string::append((string *)&expr);
                  ::std::__cxx11::string::~string((string *)&local_138);
                  ::std::__cxx11::string::~string((string *)&local_60);
                  ::std::__cxx11::string::~string((string *)indices);
                  psVar19 = (string *)&meta;
                }
                ::std::__cxx11::string::~string((string *)psVar19);
                if (pSVar14->vecsize < pSVar15->vecsize) {
                  CompilerGLSL::vector_swizzle(pSVar14->vecsize,0);
                  ::std::__cxx11::string::append((char *)&expr);
                }
              }
            }
            local_68 = local_68 + 1;
            if ((local_68 & 0xffffffff) <
                (pSVar13->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size) {
              ::std::__cxx11::string::append((char *)&expr);
            }
          }
          ::std::__cxx11::string::append((char *)&expr);
          uVar9 = uVar9 + 1;
          if (uVar9 < local_88) {
            ::std::__cxx11::string::append((char *)&expr);
          }
        }
        if (bVar3) {
          ::std::__cxx11::string::append((char *)&expr);
        }
      }
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,local_3c,id,&expr,false,false);
      Compiler::register_read((Compiler *)this,id,local_114.id,false);
      ::std::__cxx11::string::~string((string *)&expr);
      return true;
    }
  }
  return false;
}

Assistant:

bool CompilerMSL::emit_tessellation_io_load(uint32_t result_type_id, uint32_t id, uint32_t ptr)
{
	auto &ptr_type = expression_type(ptr);
	auto &result_type = get<SPIRType>(result_type_id);
	if (ptr_type.storage != StorageClassInput && ptr_type.storage != StorageClassOutput)
		return false;
	if (ptr_type.storage == StorageClassOutput && get_execution_model() == ExecutionModelTessellationEvaluation)
		return false;

	bool multi_patch_tess_ctl = get_execution_model() == ExecutionModelTessellationControl &&
	                            msl_options.multi_patch_workgroup && ptr_type.storage == StorageClassInput;
	bool flat_matrix = is_matrix(result_type) && ptr_type.storage == StorageClassInput && !multi_patch_tess_ctl;
	bool flat_struct = result_type.basetype == SPIRType::Struct && ptr_type.storage == StorageClassInput;
	bool flat_data_type = flat_matrix || is_array(result_type) || flat_struct;
	if (!flat_data_type)
		return false;

	if (has_decoration(ptr, DecorationPatch))
		return false;

	// Now, we must unflatten a composite type and take care of interleaving array access with gl_in/gl_out.
	// Lots of painful code duplication since we *really* should not unroll these kinds of loads in entry point fixup
	// unless we're forced to do this when the code is emitting inoptimal OpLoads.
	string expr;

	uint32_t interface_index = get_extended_decoration(ptr, SPIRVCrossDecorationInterfaceMemberIndex);
	auto *var = maybe_get_backing_variable(ptr);
	bool ptr_is_io_variable = ir.ids[ptr].get_type() == TypeVariable;
	auto &expr_type = get_pointee_type(ptr_type.self);

	const auto &iface_type = expression_type(stage_in_ptr_var_id);

	if (result_type.array.size() > 2)
	{
		SPIRV_CROSS_THROW("Cannot load tessellation IO variables with more than 2 dimensions.");
	}
	else if (result_type.array.size() == 2)
	{
		if (!ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading an array-of-array must be loaded directly from an IO variable.");
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");
		if (result_type.basetype == SPIRType::Struct || flat_matrix)
			SPIRV_CROSS_THROW("Cannot load array-of-array of composite type in tessellation IO.");

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, 1);
		uint32_t base_interface_index = interface_index;

		auto &sub_type = get<SPIRType>(result_type.parent_type);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			expr += type_to_glsl(sub_type) + "({ ";
			interface_index = base_interface_index;
			uint32_t array_size = to_array_size_literal(result_type, 0);
			if (multi_patch_tess_ctl)
			{
				for (uint32_t j = 0; j < array_size; j++)
				{
					const uint32_t indices[3] = { i, interface_index, j };

					AccessChainMeta meta;
					expr +=
					    access_chain_internal(stage_in_ptr_var_id, indices, 3,
					                          ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
					// If the expression has more vector components than the result type, insert
					// a swizzle. This shouldn't happen normally on valid SPIR-V, but it might
					// happen if we replace the type of an input variable.
					if (!is_matrix(sub_type) && sub_type.basetype != SPIRType::Struct &&
					    expr_type.vecsize > sub_type.vecsize)
						expr += vector_swizzle(sub_type.vecsize, 0);

					if (j + 1 < array_size)
						expr += ", ";
				}
			}
			else
			{
				for (uint32_t j = 0; j < array_size; j++, interface_index++)
				{
					const uint32_t indices[2] = { i, interface_index };

					AccessChainMeta meta;
					expr +=
					    access_chain_internal(stage_in_ptr_var_id, indices, 2,
					                          ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
					if (!is_matrix(sub_type) && sub_type.basetype != SPIRType::Struct &&
					    expr_type.vecsize > sub_type.vecsize)
						expr += vector_swizzle(sub_type.vecsize, 0);

					if (j + 1 < array_size)
						expr += ", ";
				}
			}
			expr += " })";
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else if (flat_struct)
	{
		bool is_array_of_struct = is_array(result_type);
		if (is_array_of_struct && !ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading array of struct from IO variable must come directly from IO variable.");

		uint32_t num_control_points = 1;
		if (is_array_of_struct)
		{
			num_control_points = to_array_size_literal(result_type, 0);
			expr += type_to_glsl(result_type) + "({ ";
		}

		auto &struct_type = is_array_of_struct ? get<SPIRType>(result_type.parent_type) : result_type;
		assert(struct_type.array.empty());

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			expr += type_to_glsl(struct_type) + "{ ";
			for (uint32_t j = 0; j < uint32_t(struct_type.member_types.size()); j++)
			{
				// The base interface index is stored per variable for structs.
				if (var)
				{
					interface_index =
					    get_extended_member_decoration(var->self, j, SPIRVCrossDecorationInterfaceMemberIndex);
				}

				if (interface_index == uint32_t(-1))
					SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

				const auto &mbr_type = get<SPIRType>(struct_type.member_types[j]);
				const auto &expr_mbr_type = get<SPIRType>(expr_type.member_types[j]);
				if (is_matrix(mbr_type) && ptr_type.storage == StorageClassInput && !multi_patch_tess_ctl)
				{
					expr += type_to_glsl(mbr_type) + "(";
					for (uint32_t k = 0; k < mbr_type.columns; k++, interface_index++)
					{
						if (is_array_of_struct)
						{
							const uint32_t indices[2] = { i, interface_index };
							AccessChainMeta meta;
							expr += access_chain_internal(
							    stage_in_ptr_var_id, indices, 2,
							    ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
						}
						else
							expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
						if (expr_mbr_type.vecsize > mbr_type.vecsize)
							expr += vector_swizzle(mbr_type.vecsize, 0);

						if (k + 1 < mbr_type.columns)
							expr += ", ";
					}
					expr += ")";
				}
				else if (is_array(mbr_type))
				{
					expr += type_to_glsl(mbr_type) + "({ ";
					uint32_t array_size = to_array_size_literal(mbr_type, 0);
					if (multi_patch_tess_ctl)
					{
						for (uint32_t k = 0; k < array_size; k++)
						{
							if (is_array_of_struct)
							{
								const uint32_t indices[3] = { i, interface_index, k };
								AccessChainMeta meta;
								expr += access_chain_internal(
								    stage_in_ptr_var_id, indices, 3,
								    ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
							}
							else
								expr += join(to_expression(ptr), ".", to_member_name(iface_type, interface_index), "[",
								             k, "]");
							if (expr_mbr_type.vecsize > mbr_type.vecsize)
								expr += vector_swizzle(mbr_type.vecsize, 0);

							if (k + 1 < array_size)
								expr += ", ";
						}
					}
					else
					{
						for (uint32_t k = 0; k < array_size; k++, interface_index++)
						{
							if (is_array_of_struct)
							{
								const uint32_t indices[2] = { i, interface_index };
								AccessChainMeta meta;
								expr += access_chain_internal(
								    stage_in_ptr_var_id, indices, 2,
								    ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
							}
							else
								expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
							if (expr_mbr_type.vecsize > mbr_type.vecsize)
								expr += vector_swizzle(mbr_type.vecsize, 0);

							if (k + 1 < array_size)
								expr += ", ";
						}
					}
					expr += " })";
				}
				else
				{
					if (is_array_of_struct)
					{
						const uint32_t indices[2] = { i, interface_index };
						AccessChainMeta meta;
						expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
						                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT,
						                              &meta);
					}
					else
						expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
					if (expr_mbr_type.vecsize > mbr_type.vecsize)
						expr += vector_swizzle(mbr_type.vecsize, 0);
				}

				if (j + 1 < struct_type.member_types.size())
					expr += ", ";
			}
			expr += " }";
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		if (is_array_of_struct)
			expr += " })";
	}
	else if (flat_matrix)
	{
		bool is_array_of_matrix = is_array(result_type);
		if (is_array_of_matrix && !ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading array of matrix from IO variable must come directly from IO variable.");
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		if (is_array_of_matrix)
		{
			// Loading a matrix from each control point.
			uint32_t base_interface_index = interface_index;
			uint32_t num_control_points = to_array_size_literal(result_type, 0);
			expr += type_to_glsl(result_type) + "({ ";

			auto &matrix_type = get_variable_element_type(get<SPIRVariable>(ptr));

			for (uint32_t i = 0; i < num_control_points; i++)
			{
				interface_index = base_interface_index;
				expr += type_to_glsl(matrix_type) + "(";
				for (uint32_t j = 0; j < result_type.columns; j++, interface_index++)
				{
					const uint32_t indices[2] = { i, interface_index };

					AccessChainMeta meta;
					expr +=
					    access_chain_internal(stage_in_ptr_var_id, indices, 2,
					                          ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
					if (expr_type.vecsize > result_type.vecsize)
						expr += vector_swizzle(result_type.vecsize, 0);
					if (j + 1 < result_type.columns)
						expr += ", ";
				}
				expr += ")";
				if (i + 1 < num_control_points)
					expr += ", ";
			}

			expr += " })";
		}
		else
		{
			expr += type_to_glsl(result_type) + "(";
			for (uint32_t i = 0; i < result_type.columns; i++, interface_index++)
			{
				expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
				if (expr_type.vecsize > result_type.vecsize)
					expr += vector_swizzle(result_type.vecsize, 0);
				if (i + 1 < result_type.columns)
					expr += ", ";
			}
			expr += ")";
		}
	}
	else if (ptr_is_io_variable)
	{
		assert(is_array(result_type));
		assert(result_type.array.size() == 1);
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		// We're loading an array directly from a global variable.
		// This means we're loading one member from each control point.
		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, 0);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			const uint32_t indices[2] = { i, interface_index };

			AccessChainMeta meta;
			expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
			                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
			if (expr_type.vecsize > result_type.vecsize)
				expr += vector_swizzle(result_type.vecsize, 0);

			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else
	{
		// We're loading an array from a concrete control point.
		assert(is_array(result_type));
		assert(result_type.array.size() == 1);
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t array_size = to_array_size_literal(result_type, 0);
		for (uint32_t i = 0; i < array_size; i++, interface_index++)
		{
			expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
			if (expr_type.vecsize > result_type.vecsize)
				expr += vector_swizzle(result_type.vecsize, 0);
			if (i + 1 < array_size)
				expr += ", ";
		}
		expr += " })";
	}

	emit_op(result_type_id, id, expr, false);
	register_read(id, ptr, false);
	return true;
}